

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

int __thiscall
duckdb_re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Thread *pTVar5;
  Inst *pIVar6;
  char *pcVar7;
  Inst *pIVar8;
  int in_EAX;
  uint uVar9;
  ostream *poVar10;
  int iVar11;
  IndexValue *pIVar12;
  IndexValue *pIVar13;
  bool bVar14;
  char *local_1e0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  nextq->size_ = 0;
  bVar14 = runq->size_ == 0;
  local_1e0._0_4_ = in_EAX;
  if (!bVar14) {
    pIVar12 = (runq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl;
    pcVar1 = p + -1;
    pIVar13 = pIVar12;
    local_1e0 = pcVar1;
    do {
      pTVar5 = pIVar13->value_;
      bVar2 = false;
      if (pTVar5 != (Thread *)0x0) {
        bVar2 = this->longest_;
        if (((bVar2 == true) && (this->matched_ == true)) && (*this->match_ < *pTVar5->capture)) {
          iVar11 = (pTVar5->field_0).ref;
          (pTVar5->field_0).ref = iVar11 + -1;
        }
        else {
          iVar11 = pIVar13->index_;
          pIVar6 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          uVar3 = pIVar6[iVar11].out_opcode_;
          uVar9 = uVar3 & 7;
          if (uVar9 == 1) {
            if (pIVar13 == pIVar12) {
              uVar9 = pIVar6[uVar3 >> 4].out_opcode_ & 7;
              if (uVar9 == 2) {
LAB_01cdc4da:
                memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
                this->matched_ = true;
                iVar4 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar4 + -1;
                if (iVar4 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar5;
                }
                pIVar13 = pIVar13 + 1;
                if (pIVar13 !=
                    (runq->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                    .
                    super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                    ._M_head_impl + runq->size_) {
                  do {
                    pTVar5 = pIVar13->value_;
                    if ((pTVar5 != (Thread *)0x0) &&
                       (iVar4 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar4 + -1, iVar4 < 2
                       )) {
                      pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                      this->freelist_ = pTVar5;
                    }
                    pIVar13 = pIVar13 + 1;
                  } while (pIVar13 !=
                           (runq->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                           .
                           super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                           ._M_head_impl + runq->size_);
                }
                runq->size_ = 0;
                local_1e0 = (char *)(ulong)(pIVar6[iVar11].out_opcode_ >> 4);
                pIVar8 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                         ((long)&(this->prog_->inst_).ptr_._M_t.
                                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         + 8))->_M_head_impl;
                uVar3 = pIVar8[(long)local_1e0].out_opcode_;
                uVar9 = uVar3 & 7;
                bVar2 = true;
                if ((uVar9 == 2) || ((uVar9 == 6 && ((pIVar8[uVar3 >> 4].out_opcode_ & 7) == 2)))) {
                  local_1e0 = (char *)(ulong)pIVar6[iVar11].field_1.out1_;
                }
                goto LAB_01cdc3ea;
              }
              if (uVar9 == 6) {
                if ((pIVar6[pIVar6[uVar3 >> 4].out_opcode_ >> 4].out_opcode_ & 7) == 2 ||
                    bVar2 != false) goto LAB_01cdc4da;
              }
              else if (bVar2 != false) goto LAB_01cdc4da;
            }
          }
          else if (uVar9 == 2) {
            AddToThreadq(this,nextq,uVar3 >> 4,c,context,p,pTVar5);
          }
          else if (uVar9 == 5) {
            if (p == (char *)0x0) {
              memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
              this->match_[1] = (char *)0x0;
            }
            else {
              if ((this->endmatch_ == true) && (pcVar1 != this->etext_)) goto LAB_01cdc3c9;
              if (bVar2 == false) {
                memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
                this->match_[1] = pcVar1;
                this->matched_ = true;
                iVar11 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar11 + -1;
                if (iVar11 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = pTVar5;
                }
                pIVar13 = pIVar13 + 1;
                if (pIVar13 !=
                    (runq->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                    .
                    super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                    ._M_head_impl + runq->size_) {
                  do {
                    pTVar5 = pIVar13->value_;
                    if ((pTVar5 != (Thread *)0x0) &&
                       (iVar11 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar11 + -1,
                       iVar11 < 2)) {
                      pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                      this->freelist_ = pTVar5;
                    }
                    pIVar13 = pIVar13 + 1;
                  } while (pIVar13 !=
                           (runq->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                           .
                           super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                           ._M_head_impl + runq->size_);
                }
                runq->size_ = 0;
                local_1e0 = (char *)0x0;
                bVar2 = true;
                goto LAB_01cdc3ea;
              }
              if (this->matched_ == true) {
                pcVar7 = *this->match_;
                if ((pcVar7 <= *pTVar5->capture) &&
                   ((*pTVar5->capture != pcVar7 || (pcVar1 <= this->match_[1])))) goto LAB_01cdc3c9;
              }
              memmove(this->match_,pTVar5->capture,(long)this->ncapture_ << 3);
              this->match_[1] = pcVar1;
            }
            this->matched_ = true;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Unhandled ",10)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(local_1a8,pIVar6[iVar11].out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," in step",8);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
          }
LAB_01cdc3c9:
          iVar11 = (pTVar5->field_0).ref;
          (pTVar5->field_0).ref = iVar11 + -1;
        }
        bVar2 = false;
        if (iVar11 < 2) {
          pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
          this->freelist_ = pTVar5;
        }
      }
LAB_01cdc3ea:
      if (bVar2) break;
      pIVar13 = pIVar13 + 1;
      pIVar12 = (runq->dense_).ptr_._M_t.
                super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                .
                super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                ._M_head_impl;
      bVar14 = pIVar13 == pIVar12 + runq->size_;
    } while (!bVar14);
  }
  if (bVar14) {
    runq->size_ = 0;
    local_1e0._0_4_ = 0;
  }
  return (int)local_1e0;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior (arithmetic on a null pointer)
        // by storing p instead of p-1. (What would the latter even mean?!)
        // This complements the special case in NFA::Search().
        if (p == NULL) {
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;
          break;
        }

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}